

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task6.cpp
# Opt level: O1

int main(void)

{
  istream *piVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double b;
  double c;
  double a;
  double local_50;
  double local_48;
  double local_40;
  
  piVar1 = std::istream::_M_extract<double>((double *)&std::cin);
  piVar1 = std::istream::_M_extract<double>((double *)piVar1);
  std::istream::_M_extract<double>((double *)piVar1);
  if ((local_40 != 0.0) || (NAN(local_40))) {
    dVar7 = local_50 * local_50 + local_40 * -4.0 * local_48;
    if (0.0 <= dVar7) {
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"X1 = ",5);
        dVar5 = SQRT(dVar7);
        dVar6 = dVar5;
        if (dVar7 < 0.0) {
          dVar6 = sqrt(dVar7);
        }
        poVar2 = std::ostream::_M_insert<double>(((dVar6 - local_50) * 0.5) / local_40);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        poVar2 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"X1 = ",5);
        if (dVar7 < 0.0) {
          dVar5 = sqrt(dVar7);
        }
        dVar7 = ((-local_50 - dVar5) * 0.5) / local_40;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"X = ",4);
        dVar7 = (local_50 * -0.5) / local_40;
      }
      goto LAB_0010141d;
    }
    pcVar4 = anon_var_dwarf_d32;
    lVar3 = 0x13;
  }
  else {
    if ((local_50 != 0.0) || (NAN(local_50))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"X = ",4);
      dVar7 = -local_48 / local_50;
LAB_0010141d:
      poVar2 = std::ostream::_M_insert<double>(dVar7);
      goto LAB_0010143b;
    }
    if ((local_48 != 0.0) || (NAN(local_48))) {
      pcVar4 = anon_var_dwarf_d06;
      lVar3 = 0x15;
    }
    else {
      pcVar4 = anon_var_dwarf_ce3;
      lVar3 = 0x2e;
    }
  }
  poVar2 = (ostream *)&std::cout;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
LAB_0010143b:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int
 main (void)
 {
    double a,b,c;
    cin >> a >> b >> c;
    if (!a) // первый коэф нуль
    {
        (!b ? (!c ? cout << "Бесконечно много решений" : cout << "решений нет") : cout << "X = " << -c / b) << endl;
    }
    else
    {
        double D = b*b - 4*a*c;
        if (D<0)
        {
            cout << "Корней нет" << endl;
        }
        else {
            !D ? cout << "X = " << -b / 2 / a << endl : cout << "X1 = " << (-b + sqrt(D)) / 2 / a << endl << "X1 = "
                                                             << (-b - sqrt(D)) / 2 / a << endl;
        }
    }

    return 0;
}